

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>_>
 __thiscall
wabt::MakeUnique<wabt::RefTypeExpr<(wabt::ExprType)36>,wabt::Type&,wabt::Location&>
          (wabt *this,Type *args,Location *args_1)

{
  RefTypeExpr<(wabt::ExprType)36> *this_00;
  Location *args_local_1;
  Type *args_local;
  
  this_00 = (RefTypeExpr<(wabt::ExprType)36> *)operator_new(0x40);
  RefTypeExpr<(wabt::ExprType)36>::RefTypeExpr(this_00,(Type)args->enum_,args_1);
  std::
  unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>>
  ::unique_ptr<std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>,void>
            ((unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)36>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>,_true,_true>
          )(__uniq_ptr_data<wabt::RefTypeExpr<(wabt::ExprType)36>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)36>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}